

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O2

void N_VCompare_MultiFab(Real a,N_Vector x,N_Vector z)

{
  uint uVar1;
  FabArray<amrex::FArrayBox> *this;
  FabArray<amrex::FArrayBox> *this_00;
  int j;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int k;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  MFIter mfi;
  Box local_12c;
  Array4<double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  this = *(FabArray<amrex::FArrayBox> **)((long)x->content + 8);
  this_00 = *(FabArray<amrex::FArrayBox> **)((long)z->content + 8);
  uVar1 = (this->super_FabArrayBase).n_comp;
  amrex::MFIter::MFIter(&local_90,&this->super_FabArrayBase,'\0');
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  while (local_90.currentIndex < local_90.endIndex) {
    amrex::MFIter::validbox(&local_12c,&local_90);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_d0,this,&local_90);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_110,this_00,&local_90);
    lVar11 = (long)local_12c.smallend.vect[1];
    lVar9 = (long)local_12c.smallend.vect[2];
    lVar12 = (lVar11 - local_110.begin.y) * local_110.jstride * 8 +
             (lVar9 - local_110.begin.z) * local_110.kstride * 8 +
             (long)local_12c.smallend.vect[0] * 8 + (long)local_110.begin.x * -8 + (long)local_110.p
    ;
    lVar7 = (lVar11 - local_d0.begin.y) * local_d0.jstride * 8 +
            (lVar9 - local_d0.begin.z) * local_d0.kstride * 8 + (long)local_12c.smallend.vect[0] * 8
            + (long)local_d0.begin.x * -8 + (long)local_d0.p;
    for (uVar3 = 0; lVar4 = lVar12, lVar8 = lVar7, lVar10 = lVar9, uVar3 != uVar1; uVar3 = uVar3 + 1
        ) {
      for (; lVar2 = lVar11, lVar5 = lVar4, lVar13 = lVar8, lVar10 <= local_12c.bigend.vect[2];
          lVar10 = lVar10 + 1) {
        for (; lVar2 <= local_12c.bigend.vect[1]; lVar2 = lVar2 + 1) {
          if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
            lVar6 = 0;
            do {
              *(ulong *)(lVar5 + lVar6 * 8) =
                   -(ulong)(a <= ABS(*(double *)(lVar13 + lVar6 * 8))) & 0x3ff0000000000000;
              lVar6 = lVar6 + 1;
            } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 != (int)lVar6);
          }
          lVar5 = lVar5 + local_110.jstride * 8;
          lVar13 = lVar13 + local_d0.jstride * 8;
        }
        lVar4 = lVar4 + local_110.kstride * 8;
        lVar8 = lVar8 + local_d0.kstride * 8;
      }
      lVar12 = lVar12 + local_110.nstride * 8;
      lVar7 = lVar7 + local_d0.nstride * 8;
    }
    amrex::MFIter::operator++(&local_90);
  }
  amrex::MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void N_VCompare_MultiFab(amrex::Real a, N_Vector x, N_Vector z)
{
    using namespace amrex;

    amrex::MultiFab *mf_x = amrex::sundials::getMFptr(x);
    amrex::MultiFab *mf_z = amrex::sundials::getMFptr(z);
    sunindextype ncomp = mf_x->nComp();

    // ghost cells not included
    for (MFIter mfi(*mf_x); mfi.isValid(); ++mfi)
    {
         const amrex::Box& bx = mfi.validbox();
         Array4<Real> const& x_fab = mf_x->array(mfi);
         Array4<Real> const& z_fab = mf_z->array(mfi);
         const auto lo = lbound(bx);
         const auto hi = ubound(bx);

         amrex::ParallelFor(bx, ncomp,
         [=] AMREX_GPU_DEVICE (int i, int j, int k, int c) noexcept
         {
           z_fab(i,j,k,c) = (SUNRabs(x_fab(i,j,k,c)) >= a) ? amrex::Real(1.0) : amrex::Real(0.0);
         });
    }

    return;
}